

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O3

void nhdp_domain_process_willingness_tlv
               (uint8_t *mprtypes,size_t mprtypes_size,rfc5444_reader_tlvblock_entry *tlv)

{
  byte bVar1;
  list_entity *plVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  
  _flooding_domain._tmp_willingness = '\0';
  for (plVar2 = _domain_list.next; plVar2->prev != _domain_list.prev; plVar2 = plVar2->next) {
    *(undefined1 *)((long)&plVar2[-0x27].prev + 1) = 0;
  }
  if (tlv != (rfc5444_reader_tlvblock_entry *)0x0) {
    uVar5 = *tlv->single_value & 0xf;
    _flooding_domain._tmp_willingness = (uint8_t)uVar5;
    if ((log_global_mask[LOG_NHDP_R] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2c4,(void *)0x0,0,
               "Received flooding willingness: %u",(ulong)uVar5);
    }
    if (mprtypes_size != 0) {
      sVar6 = 0;
      do {
        bVar1 = mprtypes[sVar6];
        plVar2 = &_domain_list;
        do {
          plVar2 = plVar2->next;
          if (plVar2->prev == _domain_list.prev) goto LAB_0012a451;
        } while (*(byte *)((long)&plVar2[-0x27].next + 1) != bVar1);
        uVar4 = sVar6 + 1 >> 1;
        if (uVar4 < tlv->length) {
          bVar3 = tlv->single_value[uVar4] & 0xf;
          if (((ulong)plVar2[-0x27].next & 0x100000000) == 0) {
            bVar3 = tlv->single_value[uVar4] >> 4;
          }
          *(byte *)((long)&plVar2[-0x27].prev + 1) = bVar3;
          if ((log_global_mask[LOG_NHDP_R] & 1) != 0) {
            oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2db,(void *)0x0,0
                     ,"Received routing willingness for domain %u: %u",(ulong)bVar1,(ulong)bVar3);
          }
        }
LAB_0012a451:
        sVar6 = sVar6 + 1;
      } while (sVar6 != mprtypes_size);
    }
  }
  return;
}

Assistant:

void
nhdp_domain_process_willingness_tlv(
  uint8_t *mprtypes, size_t mprtypes_size, struct rfc5444_reader_tlvblock_entry *tlv) {
  struct nhdp_domain *domain;
  size_t idx, i;
  uint8_t value;

  _flooding_domain._tmp_willingness = RFC7181_WILLINGNESS_NEVER;
  list_for_each_element(&_domain_list, domain, _node) {
    domain->_tmp_willingness = RFC7181_WILLINGNESS_NEVER;
  }

  if (!tlv) {
    return;
  }

  /* copy flooding willingness */
  _flooding_domain._tmp_willingness = tlv->single_value[0] & RFC7181_WILLINGNESS_MASK;
  OONF_DEBUG(LOG_NHDP_R, "Received flooding willingness: %u", _flooding_domain._tmp_willingness);

  for (i = 0; i < mprtypes_size; i++) {
    domain = nhdp_domain_get_by_ext(mprtypes[i]);
    if (domain == NULL) {
      continue;
    }

    idx = (i + 1) / 2;
    if (idx >= tlv->length) {
      continue;
    }

    value = tlv->single_value[idx];
    if ((domain->index & 1) == 0) {
      value >>= RFC7181_WILLINGNESS_SHIFT;
    }
    else {
      value &= RFC7181_WILLINGNESS_MASK;
    }

    domain->_tmp_willingness = value;

    OONF_DEBUG(LOG_NHDP_R, "Received routing willingness for domain %u: %u", domain->ext, domain->_tmp_willingness);
  }
}